

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plastic.hpp
# Opt level: O1

Color __thiscall
PlasticBSDF::sample_f
          (PlasticBSDF *this,vec3f *wo,vec3f *wi,HitInfo *hit,bool *isDirac,Sampler *sampler)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  float fVar4;
  undefined4 uVar5;
  Image *this_00;
  undefined1 auVar6 [16];
  undefined4 uVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Color CVar13;
  float pdf;
  float local_9c;
  Sampler *local_98;
  bool *local_90;
  vec3f *local_88;
  vec3f local_80;
  vec3f local_70;
  vec3f local_60;
  vec3f local_50;
  Color local_40;
  
  local_50.x = 0.0;
  local_50.y = 0.0;
  local_50.z = 0.0;
  local_60.x = 0.0;
  local_60.y = 0.0;
  local_60.z = 0.0;
  local_98 = sampler;
  local_90 = isDirac;
  local_88 = wi;
  BSDF::getLocalBasis(&(hit->super_Hit).Ns,&local_50,&local_60);
  local_70.x = 0.0;
  local_70.y = 0.0;
  local_70.z = 0.0;
  fVar2 = wo->x;
  fVar4 = wo->y;
  fVar1 = wo->z;
  local_80.z = (hit->super_Hit).Ns.z * fVar1 +
               (hit->super_Hit).Ns.x * fVar2 + (hit->super_Hit).Ns.y * fVar4;
  local_80.y = fVar1 * local_60.z + fVar2 * local_60.x + local_60.y * fVar4;
  local_80.x = fVar1 * local_50.z + fVar2 * local_50.x + local_50.y * fVar4;
  this_00 = (this->super_BSDF).albedoTexture;
  if (this_00 == (Image *)0x0) {
    fVar2 = (this->super_BSDF).albedoConst.x;
    fVar4 = (this->super_BSDF).albedoConst.y;
    local_40.z = (this->super_BSDF).albedoConst.z;
  }
  else {
    local_40._0_8_ = (ulong)(hit->super_Hit).uv ^ 0x8000000000000000;
    CVar13 = Image::sample(this_00,(vec2f *)&local_40);
    local_40.z = CVar13.z;
    fVar2 = CVar13.x;
    fVar4 = CVar13.y;
  }
  local_40.y = fVar4;
  local_40.x = fVar2;
  CVar13 = sample_f(this,&local_40,&local_80,&local_70,&local_9c,local_90,local_98);
  uVar3 = (hit->super_Hit).Ns.x;
  uVar5 = (hit->super_Hit).Ns.y;
  fVar10 = (hit->super_Hit).Ns.z * local_70.z + local_50.z * local_70.x + local_60.z * local_70.y;
  local_88->x = local_70.z * (float)uVar3 + local_70.y * local_60.x + local_70.x * local_50.x;
  local_88->y = local_70.z * (float)uVar5 + local_70.y * local_60.y + local_70.x * local_50.y;
  local_88->z = fVar10;
  fVar2 = (hit->super_Hit).Ng.x;
  fVar4 = (hit->super_Hit).Ng.y;
  fVar1 = (hit->super_Hit).Ng.z;
  auVar11._0_12_ = ZEXT812(0);
  auVar11._12_4_ = 0;
  iVar8 = -(uint)(0.0 < fVar1 * wo->z + fVar2 * wo->x + wo->y * fVar4);
  iVar9 = -(uint)(0.0 < fVar1 * fVar10 + fVar2 * local_88->x + local_88->y * fVar4);
  auVar12._4_4_ = iVar8;
  auVar12._0_4_ = iVar8;
  auVar12._8_4_ = iVar9;
  auVar12._12_4_ = iVar9;
  uVar7 = movmskpd((int)local_88,auVar12);
  fVar2 = 0.0;
  if ((POPCOUNT((char)uVar7) & 1U) == 0) {
    auVar11._0_8_ = CVar13._0_8_;
    auVar11._8_4_ = extraout_XMM0_Dc;
    auVar11._12_4_ = extraout_XMM0_Dd;
    fVar2 = CVar13.z;
  }
  auVar6._4_4_ = local_9c;
  auVar6._0_4_ = local_9c;
  auVar6._8_4_ = local_9c;
  auVar6._12_4_ = local_9c;
  auVar12 = divps(auVar11,auVar6);
  CVar13.z = fVar2 / local_9c;
  CVar13.x = (float)(int)auVar12._0_8_;
  CVar13.y = (float)(int)((ulong)auVar12._0_8_ >> 0x20);
  return CVar13;
}

Assistant:

Color sample_f(const vec3f& wo, vec3f& wi, const HitInfo& hit, bool& isDirac, Sampler& sampler) const
	{
		// generate sample
		vec3f N1,N2;
		getLocalBasis(hit.Ns, N1, N2);
		vec3f wiL, woL = vec3f(dot(wo,N1), dot(wo,N2), dot(wo,hit.Ns));
		float pdf;
		Color f0 = sample_f(albedo(hit.uv), woL, wiL, pdf, isDirac, sampler);
		wi = wiL.x * N1 + wiL.y * N2 + wiL.z * hit.Ns;
		// recalculate to make sure
		// Ng is used to determine whether BRDF or BTDF is used
		bool through = (dot(wo, hit.Ng)>0) ^ (dot(wi, hit.Ng)>0);
		BxDF::Type allowed = through? BxDF::TRANSMIT : BxDF::REFLECT;
		Color val = (BxDF::REFLECT & allowed)? f0: 0;
		return val / pdf;
	}